

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double half_normal_sample(double a,double b,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  dVar4 = half_normal_cdf_inv((double)iVar1 * 4.656612875e-10,a,b);
  return dVar4;
}

Assistant:

double half_normal_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    HALF_NORMAL_SAMPLE samples the Half Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double HALF_NORMAL_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = half_normal_cdf_inv ( cdf, a, b );

  return x;
}